

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

ArgSlot EmitNewObjectOfConstants
                  (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                  uint argCount)

{
  FuncInfo *byteCodeGenerator_00;
  ArgSlot AVar1;
  uint32 uVar2;
  RegSlot destinationRegister;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  VarArrayVarCount *pVVar4;
  Var count;
  ParseNodeCall *pPVar5;
  ByteCodeWriter *pBVar6;
  ArenaAllocator *allocator;
  ArgSlot actualArgCount;
  TrackAllocData local_58;
  VarArrayVarCount *local_30;
  VarArrayVarCount *vars;
  FuncInfo *pFStack_20;
  uint argCount_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  vars._4_4_ = argCount;
  pFStack_20 = funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnode;
  EmitArgListStart(0xffffffff,byteCodeGenerator,funcInfo,0xffff);
  pAVar3 = &ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  uVar2 = UInt32Math::Mul(vars._4_4_ - 1,8);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&Js::VarArrayVarCount::typeinfo,(ulong)uVar2,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
             ,0x1e90);
  pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar3,&local_58);
  UInt32Math::Mul(vars._4_4_ - 1,8);
  pVVar4 = (VarArrayVarCount *)new<Memory::ArenaAllocator>(8,(ArenaAllocator *)pAVar3,0x3f67b0,0);
  count = Js::TaggedInt::ToVarUnchecked(vars._4_4_ - 1);
  Js::VarArrayVarCount::VarArrayVarCount(pVVar4,count);
  byteCodeGenerator_00 = funcInfo_local;
  local_30 = pVVar4;
  pPVar5 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
  EmitConstantArgsToVarArray
            ((ByteCodeGenerator *)byteCodeGenerator_00,&pVVar4[1].count,pPVar5->pnodeArgs,
             vars._4_4_ - 1);
  pPVar5 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
  AVar1 = EmitArgListEnd(pPVar5->pnodeArgs,0xffffffff,0xffffffff,0xffffffff,
                         (ByteCodeGenerator *)funcInfo_local,pFStack_20,(ulong)(vars._4_4_ - 1),
                         0xffff);
  pBVar6 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
  pPVar5 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
  Js::ByteCodeWriter::RemoveEntryForRegSlotFromCacheIdMap(pBVar6,pPVar5->pnodeTarget->location);
  pBVar6 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
  destinationRegister = FuncInfo::AcquireLoc(pFStack_20,(ParseNode *)byteCodeGenerator_local);
  pVVar4 = local_30;
  uVar2 = UInt32Math::MulAdd<8u,8u>(vars._4_4_ - 1);
  pPVar5 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
  Js::ByteCodeWriter::AuxiliaryContext
            (pBVar6,NewScObject_A,destinationRegister,pVVar4,uVar2,pPVar5->pnodeTarget->location);
  allocator = ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local);
  pVVar4 = local_30;
  uVar2 = UInt32Math::Mul(vars._4_4_ - 1,8);
  Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::VarArrayVarCount>
            (allocator,pVVar4,(ulong)uVar2);
  return AVar1;
}

Assistant:

Js::ArgSlot EmitNewObjectOfConstants(
    ParseNode *pnode,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    unsigned int argCount)
{
    EmitArgListStart(Js::Constants::NoRegister, byteCodeGenerator, funcInfo, Js::Constants::NoProfileId);

    // Create the vars array
    Js::VarArrayVarCount *vars = AnewPlus(byteCodeGenerator->GetAllocator(), UInt32Math::Mul((argCount - 1), sizeof(Js::Var)), Js::VarArrayVarCount, Js::TaggedInt::ToVarUnchecked(argCount - 1));

    // Emit all constants to the vars array
    EmitConstantArgsToVarArray(byteCodeGenerator, vars->elements, pnode->AsParseNodeCall()->pnodeArgs, argCount - 1);

    // Finish the arg list
    Js::ArgSlot actualArgCount = EmitArgListEnd(
        pnode->AsParseNodeCall()->pnodeArgs,
        Js::Constants::NoRegister,
        Js::Constants::NoRegister,
        Js::Constants::NoRegister,
        byteCodeGenerator,
        funcInfo,
        argCount - 1,
        Js::Constants::NoProfileId);

    // Make sure the cacheId to regSlot map in the ByteCodeWriter is left in a consistent state after writing NewScObject_A
    byteCodeGenerator->Writer()->RemoveEntryForRegSlotFromCacheIdMap(pnode->AsParseNodeCall()->pnodeTarget->location);

    // Generate the opcode with vars
    byteCodeGenerator->Writer()->AuxiliaryContext(
        Js::OpCode::NewScObject_A,
        funcInfo->AcquireLoc(pnode),
        vars,
        UInt32Math::MulAdd<sizeof(Js::Var), sizeof(Js::VarArray)>((argCount-1)),
        pnode->AsParseNodeCall()->pnodeTarget->location);


        AdeletePlus(byteCodeGenerator->GetAllocator(), UInt32Math::Mul((argCount-1), sizeof(Js::VarArrayVarCount)), vars);

    return actualArgCount;
}